

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicstransform.cpp
# Opt level: O0

void __thiscall QGraphicsRotation::setAxis(QGraphicsRotation *this,QVector3D *axis)

{
  long lVar1;
  QVector3D v2;
  QVector3D v1;
  bool bVar2;
  QGraphicsRotationPrivate *this_00;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QGraphicsRotationPrivate *d;
  float fVar3;
  undefined4 in_stack_ffffffffffffffc4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  fVar3 = (float)((ulong)in_RDI >> 0x20);
  this_00 = d_func((QGraphicsRotation *)0xa2e27e);
  v1.v[1] = (float)in_stack_ffffffffffffffc4;
  v1.v[0] = (float)*(undefined4 *)(in_RSI + 1);
  v1.v[2] = (float)*(undefined8 *)(this_00->axis).v;
  v2.v._4_8_ = *in_RSI;
  v2.v[0] = fVar3;
  bVar2 = ::operator==(v1,v2);
  if (!bVar2) {
    *(undefined8 *)(this_00->axis).v = *in_RSI;
    (this_00->axis).v[2] = *(float *)(in_RSI + 1);
    QGraphicsTransform::update((QGraphicsTransform *)this_00);
    axisChanged((QGraphicsRotation *)0xa2e32a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsRotation::setAxis(const QVector3D &axis)
{
    Q_D(QGraphicsRotation);
    if (d->axis == axis)
         return;
    d->axis = axis;
    update();
    emit axisChanged();
}